

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

bool __thiscall
Assimp::FBX::FBXConverter::NeedsComplexTransformationChain(FBXConverter *this,Model *model)

{
  PropertyTable *in;
  char *pcVar1;
  float fVar2;
  aiVector3t<float> aVar3;
  bool local_d9;
  aiVector3t<float> local_bc;
  aiVector3t<float> local_b0 [3];
  allocator local_89;
  string local_88;
  aiVector3t<float> local_64;
  aiVector3t<float> *local_58;
  aiVector3D *v;
  bool scale_compare;
  ulong uStack_48;
  TransformationComp comp;
  size_t i;
  aiVector3D all_ones;
  float zero_epsilon;
  bool ok;
  PropertyTable *props;
  Model *model_local;
  FBXConverter *this_local;
  
  in = Model::Props(model);
  all_ones.y = 1e-06;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&i + 4),1.0,1.0,1.0);
  uStack_48 = 0;
  do {
    if (0x10 < uStack_48) {
      return false;
    }
    v._4_4_ = (TransformationComp)uStack_48;
    if (((v._4_4_ != TransformationComp_Rotation) && (v._4_4_ != TransformationComp_Scaling)) &&
       (v._4_4_ != TransformationComp_Translation)) {
      local_d9 = v._4_4_ == TransformationComp_GeometricScaling ||
                 v._4_4_ == TransformationComp_Scaling;
      v._3_1_ = local_d9;
      pcVar1 = NameTransformationCompProperty(this,v._4_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_88,pcVar1,&local_89);
      aVar3 = PropertyGet<aiVector3t<float>>(in,&local_88,(bool *)((long)&all_ones.z + 3),false);
      local_b0[0].z = aVar3.z;
      local_b0[0]._0_8_ = aVar3._0_8_;
      local_64._0_8_ = local_b0[0]._0_8_;
      local_64.z = local_b0[0].z;
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      local_58 = &local_64;
      if (((all_ones.z._3_1_ & 1) == 0) || ((v._3_1_ & 1) == 0)) {
        if (((all_ones.z._3_1_ & 1) != 0) &&
           (fVar2 = aiVector3t<float>::SquareLength(local_58), 1e-06 < fVar2)) {
          return true;
        }
      }
      else {
        aVar3 = ::operator-(local_58,(aiVector3t<float> *)((long)&i + 4));
        local_bc.z = aVar3.z;
        local_bc._0_8_ = aVar3._0_8_;
        fVar2 = aiVector3t<float>::SquareLength(&local_bc);
        if (1e-06 < fVar2) {
          return true;
        }
      }
    }
    uStack_48 = uStack_48 + 1;
  } while( true );
}

Assistant:

bool FBXConverter::NeedsComplexTransformationChain(const Model& model)
        {
            const PropertyTable& props = model.Props();
            bool ok;

            const float zero_epsilon = 1e-6f;
            const aiVector3D all_ones(1.0f, 1.0f, 1.0f);
            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                if (comp == TransformationComp_Rotation || comp == TransformationComp_Scaling || comp == TransformationComp_Translation) {
                    continue;
                }

                bool scale_compare = (comp == TransformationComp_GeometricScaling || comp == TransformationComp_Scaling);

                const aiVector3D& v = PropertyGet<aiVector3D>(props, NameTransformationCompProperty(comp), ok);
                if (ok && scale_compare) {
                    if ((v - all_ones).SquareLength() > zero_epsilon) {
                        return true;
                    }
                } else if (ok) {
                    if (v.SquareLength() > zero_epsilon) {
                        return true;
                    }
                }
            }

            return false;
        }